

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O0

int64_t HighsIntegers::modularInverse(int64_t a,int64_t m)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  int64_t in_RDI;
  int64_t r;
  int64_t q;
  int64_t x;
  int64_t y;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_20 = 0;
  local_28 = 1;
  if (in_RSI == 1) {
    local_8 = 0;
  }
  else {
    local_10 = mod(in_RDI,in_RSI);
    local_18 = in_RSI;
    while (1 < local_10) {
      lVar1 = local_10 - (local_10 / local_18) * local_18;
      lVar2 = local_28 - (local_10 / local_18) * local_20;
      local_28 = local_20;
      local_10 = local_18;
      local_20 = lVar2;
      local_18 = lVar1;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static int64_t modularInverse(int64_t a, int64_t m) {
    int64_t y = 0;
    int64_t x = 1;

    if (m == 1) return 0;

    a = mod(a, m);

    while (a > 1) {
      // compute quotient q = a / m and remainder r = a % m
      int64_t q = a / m;
      int64_t r = a - q * m;

      // update (a,m) = (m,r)
      a = m;
      m = r;

      // update x and y of extended euclidean algorithm
      r = x - q * y;
      x = y;
      y = r;
    }

    return x;
  }